

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::CumulativeReporterBase::CumulativeReporterBase
          (CumulativeReporterBase *this,ReporterConfig *_config)

{
  IConfig *pIVar1;
  
  (this->super_SharedImpl<Catch::IStreamingReporter>).m_rc = 0;
  (this->super_SharedImpl<Catch::IStreamingReporter>).super_IStreamingReporter.super_IShared.
  super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__CumulativeReporterBase_00171d10;
  pIVar1 = (_config->m_fullConfig).m_p;
  (this->m_config).m_p = pIVar1;
  if (pIVar1 != (IConfig *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
  }
  this->stream = _config->m_stream;
  memset(&this->m_assertions,0,0xa1);
  return;
}

Assistant:

CumulativeReporterBase( ReporterConfig const& _config )
        :   m_config( _config.fullConfig() ),
            stream( _config.stream() )
        {
            m_reporterPrefs.shouldRedirectStdOut = false;
        }